

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

string * __thiscall
BCLog::Logger::LogTimestampStr_abi_cxx11_
          (string *__return_storage_ptr__,Logger *this,time_point now,seconds mocktime)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long in_FS_OFFSET;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->m_log_timestamps == true) {
    FormatISO8601DateTime_abi_cxx11_(&local_58,(long)now.__d.__r / 1000000000);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_58.field_2;
    if ((this->m_log_time_micros == true) && (__return_storage_ptr__->_M_string_length != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (__return_storage_ptr__);
      local_78._M_dataplus._M_p = (pointer)(((long)now.__d.__r % 1000000000) / 1000);
      tinyformat::format<long>(&local_58,".%06dZ",(long *)&local_78);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (0 < mocktime.__r) {
      FormatISO8601DateTime_abi_cxx11_(&local_98,mocktime.__r);
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_98,0,0," (mocktime: ",0xc);
      local_78._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar3 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == paVar3) {
        local_78.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      }
      local_78._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_78,")");
      local_58._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar3 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == paVar3) {
        local_58.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_58._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_58.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
      }
      local_58._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,' ');
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string BCLog::Logger::LogTimestampStr(SystemClock::time_point now, std::chrono::seconds mocktime) const
{
    std::string strStamped;

    if (!m_log_timestamps)
        return strStamped;

    const auto now_seconds{std::chrono::time_point_cast<std::chrono::seconds>(now)};
    strStamped = FormatISO8601DateTime(TicksSinceEpoch<std::chrono::seconds>(now_seconds));
    if (m_log_time_micros && !strStamped.empty()) {
        strStamped.pop_back();
        strStamped += strprintf(".%06dZ", Ticks<std::chrono::microseconds>(now - now_seconds));
    }
    if (mocktime > 0s) {
        strStamped += " (mocktime: " + FormatISO8601DateTime(count_seconds(mocktime)) + ")";
    }
    strStamped += ' ';

    return strStamped;
}